

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::SupportedInTCS
          (ShaderImageLoadStoreBase *this,int requiredTCS)

{
  int iVar1;
  ostream *poVar2;
  GLint imagesTCS;
  ostringstream reason;
  int local_1bc;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x90cb,&local_1bc);
  iVar1 = local_1bc;
  if (local_1bc < requiredTCS) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Required ",9);
    poVar2 = (ostream *)std::ostream::operator<<(local_198,requiredTCS);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," TCS image uniforms but only ",0x1d);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1bc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," available.",0xb);
    std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    deqp::SubcaseBase::OutputNotSupported(&this->super_SubcaseBase,&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
  }
  return requiredTCS <= iVar1;
}

Assistant:

bool SupportedInTCS(int requiredTCS)
	{
		GLint imagesTCS;
		glGetIntegerv(GL_MAX_TESS_CONTROL_IMAGE_UNIFORMS, &imagesTCS);
		if (imagesTCS >= requiredTCS)
			return true;
		else
		{
			std::ostringstream reason;
			reason << "Required " << requiredTCS << " TCS image uniforms but only " << imagesTCS << " available."
				   << std::endl;
			OutputNotSupported(reason.str());
			return false;
		}
	}